

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O3

void rw::Image::setSearchPath(char *path)

{
  int *piVar1;
  char cVar2;
  long lVar3;
  char *__s;
  char *pcVar4;
  long lVar5;
  
  lVar3 = engine;
  lVar5 = (long)imageModuleOffset;
  (*DAT_00149de0)(*(undefined8 *)(engine + lVar5));
  *(undefined4 *)(lVar3 + 8 + lVar5) = 0;
  if (path == (char *)0x0) {
    *(undefined8 *)(lVar3 + lVar5) = 0;
  }
  else {
    __s = strdup_LOC(path,0x30000,
                     "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/image.cpp line: 905"
                    );
    *(char **)(lVar3 + lVar5) = __s;
    if (__s != (char *)0x0) {
      cVar2 = *__s;
      while (cVar2 != '\0') {
        pcVar4 = strchr(__s,0x3b);
        if (pcVar4 == (char *)0x0) {
          piVar1 = (int *)(lVar3 + 8 + lVar5);
          *piVar1 = *piVar1 + 1;
          return;
        }
        *pcVar4 = '\0';
        piVar1 = (int *)(lVar3 + 8 + lVar5);
        *piVar1 = *piVar1 + 1;
        __s = pcVar4 + 1;
        cVar2 = pcVar4[1];
      }
    }
  }
  return;
}

Assistant:

void
Image::setSearchPath(const char *path)
{
	char *p, *end;
	ImageGlobals *g = PLUGINOFFSET(ImageGlobals, engine, imageModuleOffset);
	rwFree(g->searchPaths);
	g->numSearchPaths = 0;
	if(path)
		g->searchPaths = p = rwStrdup(path, MEMDUR_EVENT);
	else{
		g->searchPaths = nil;
		return;
	}
	while(p && *p){
		end = strchr(p, ';');
		if(end)
			*end++ = '\0';
		g->numSearchPaths++;
		p = end;
	}
}